

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_clear(secp256k1_ge *r)

{
  r->infinity = 0;
  secp256k1_fe_impl_clear(&r->x);
  secp256k1_fe_impl_clear(&r->y);
  return;
}

Assistant:

static void secp256k1_ge_clear(secp256k1_ge *r) {
    r->infinity = 0;
    secp256k1_fe_clear(&r->x);
    secp256k1_fe_clear(&r->y);

    SECP256K1_GE_VERIFY(r);
}